

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# network.c
# Opt level: O0

Socket * sk_newlistener(char *srcaddr,int port,Plug *plug,_Bool param_4,int orig_address_family)

{
  int iVar1;
  int *piVar2;
  _func_Plug_ptr_Socket_ptr_Plug_ptr *p_Var3;
  char *__name;
  Socket *pSVar4;
  NetSocket *pNVar5;
  int local_134;
  NetSocket *other;
  char *trimmed_addr;
  int local_118;
  int on;
  int address_family;
  int retcode;
  NetSocket *ret;
  sockaddr *psStack_100;
  int addrlen;
  sockaddr_union *addr;
  sockaddr_union u;
  addrinfo *paStack_70;
  char portstr [6];
  addrinfo *ai;
  addrinfo hints;
  int s;
  int orig_address_family_local;
  _Bool local_host_only_local;
  Plug *plug_local;
  int port_local;
  char *srcaddr_local;
  
  paStack_70 = (addrinfo *)0x0;
  trimmed_addr._4_4_ = 1;
  _address_family = (NetSocket *)safemalloc(1,0x98,0);
  (_address_family->sock).vt = &NetSocket_sockvt;
  _address_family->error = (char *)0x0;
  _address_family->plug = plug;
  bufchain_init(&_address_family->output_data);
  _address_family->writable = false;
  _address_family->sending_oob = 0;
  _address_family->frozen = false;
  _address_family->localhost_only = param_4;
  _address_family->pending_error = 0;
  _address_family->child = (NetSocket *)0x0;
  _address_family->parent = (NetSocket *)0x0;
  _address_family->oobpending = false;
  _address_family->outgoingeof = EOF_NO;
  _address_family->incomingeof = false;
  _address_family->listener = true;
  _address_family->addr = (SockAddr *)0x0;
  _address_family->s = 0xffffffff;
  if (orig_address_family == 1) {
    local_134 = 2;
  }
  else {
    local_134 = 0;
    if (orig_address_family == 2) {
      local_134 = 10;
    }
  }
  local_118 = local_134;
  if (local_134 == 0) {
    local_118 = 10;
  }
  hints.ai_next._4_4_ = socket(local_118,1,0);
  if ((hints.ai_next._4_4_ < 0) && (local_118 == 10)) {
    local_118 = 2;
    hints.ai_next._4_4_ = socket(2,1,0);
  }
  if (hints.ai_next._4_4_ < 0) {
    piVar2 = __errno_location();
    p_Var3 = (_func_Plug_ptr_Socket_ptr_Plug_ptr *)strerror(*piVar2);
    _address_family->error = (char *)p_Var3;
    srcaddr_local = (char *)&_address_family->sock;
  }
  else {
    cloexec(hints.ai_next._4_4_);
    _address_family->oobinline = false;
    iVar1 = setsockopt(hints.ai_next._4_4_,1,2,(void *)((long)&trimmed_addr + 4),4);
    if (iVar1 < 0) {
      piVar2 = __errno_location();
      p_Var3 = (_func_Plug_ptr_Socket_ptr_Plug_ptr *)strerror(*piVar2);
      _address_family->error = (char *)p_Var3;
      close(hints.ai_next._4_4_);
      srcaddr_local = (char *)&_address_family->sock;
    }
    else {
      on = -1;
      psStack_100 = (sockaddr *)0x0;
      ret._4_4_ = 0xffffffff;
      if (srcaddr != (char *)0x0) {
        ai._0_4_ = 4;
        ai._4_4_ = local_118;
        hints.ai_flags = 1;
        hints.ai_family = 0;
        hints.ai_socktype = 0;
        hints.ai_addrlen = 0;
        hints._20_4_ = 0;
        hints.ai_addr = (sockaddr *)0x0;
        hints.ai_canonname = (char *)0x0;
        if ((port < 0) || (99999 < port)) {
          __assert_fail("port >= 0 && port <= 99999",
                        "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/unix/network.c"
                        ,0x37c,"Socket *sk_newlistener(const char *, int, Plug *, _Bool, int)");
        }
        sprintf((char *)((long)&u.storage.__ss_align + 2),"%d",(ulong)(uint)port);
        __name = host_strduptrim(srcaddr);
        on = getaddrinfo(__name,(char *)((long)&u.storage.__ss_align + 2),(addrinfo *)&ai,
                         &stack0xffffffffffffff90);
        safefree(__name);
        if (on == 0) {
          psStack_100 = paStack_70->ai_addr;
          ret._4_4_ = paStack_70->ai_addrlen;
        }
      }
      if (on != 0) {
        memset(&addr,0,0x80);
        if (local_118 == 10) {
          addr._0_2_ = 10;
          addr._2_2_ = htons((uint16_t)port);
          if (param_4) {
            u._0_8_ = _in6addr_loopback;
            u._8_1_ = ioctl;
            u._9_1_ = ioctl_1;
            u._10_1_ = uRam00000000001931ea;
            u._11_1_ = uRam00000000001931eb;
            u._12_1_ = uRam00000000001931ec;
            u._13_1_ = uRam00000000001931ed;
            u._14_1_ = uRam00000000001931ee;
            u._15_1_ = uRam00000000001931ef;
          }
          else {
            u._0_8_ = _in6addr_any;
            u._8_1_ = isatty;
            u._9_1_ = isatty_1;
            u._10_1_ = uRam00000000001930aa;
            u._11_1_ = uRam00000000001930ab;
            u._12_1_ = uRam00000000001930ac;
            u._13_1_ = uRam00000000001930ad;
            u._14_1_ = uRam00000000001930ae;
            u._15_1_ = uRam00000000001930af;
          }
          ret._4_4_ = 0x1c;
        }
        else {
          addr._0_2_ = 2;
          addr._2_2_ = htons((uint16_t)port);
          if (param_4) {
            addr._4_4_ = htonl(0x7f000001);
          }
          else {
            addr._4_4_ = htonl(0);
          }
          ret._4_4_ = 0x10;
        }
        psStack_100 = (sockaddr *)&addr;
      }
      on = bind(hints.ai_next._4_4_,psStack_100,ret._4_4_);
      if (paStack_70 != (addrinfo *)0x0) {
        freeaddrinfo(paStack_70);
      }
      if (on < 0) {
        close(hints.ai_next._4_4_);
        piVar2 = __errno_location();
        p_Var3 = (_func_Plug_ptr_Socket_ptr_Plug_ptr *)strerror(*piVar2);
        _address_family->error = (char *)p_Var3;
        srcaddr_local = (char *)&_address_family->sock;
      }
      else {
        iVar1 = listen(hints.ai_next._4_4_,0x1000);
        if (iVar1 < 0) {
          close(hints.ai_next._4_4_);
          piVar2 = __errno_location();
          p_Var3 = (_func_Plug_ptr_Socket_ptr_Plug_ptr *)strerror(*piVar2);
          _address_family->error = (char *)p_Var3;
          srcaddr_local = (char *)&_address_family->sock;
        }
        else {
          if ((local_118 == 10) && (orig_address_family == 0)) {
            pSVar4 = sk_newlistener(srcaddr,port,plug,param_4,1);
            pNVar5 = (NetSocket *)(pSVar4 + -0x12);
            if (pNVar5 != (NetSocket *)0x0) {
              if ((SocketVtable *)pNVar5->error != (SocketVtable *)0x0) {
                close(hints.ai_next._4_4_);
                safefree(_address_family);
                return pSVar4;
              }
              pSVar4[-2].vt = (SocketVtable *)_address_family;
              _address_family->child = pNVar5;
            }
          }
          _address_family->s = hints.ai_next._4_4_;
          uxsel_tell(_address_family);
          add234(sktree,_address_family);
          srcaddr_local = (char *)&_address_family->sock;
        }
      }
    }
  }
  return (Socket *)srcaddr_local;
}

Assistant:

Socket *sk_newlistener(const char *srcaddr, int port, Plug *plug,
                       bool local_host_only, int orig_address_family)
{
    int s;
#ifndef NO_IPV6
    struct addrinfo hints, *ai = NULL;
    char portstr[6];
#endif
    union sockaddr_union u;
    union sockaddr_union *addr;
    int addrlen;
    NetSocket *ret;
    int retcode;
    int address_family;
    int on = 1;

    /*
     * Create NetSocket structure.
     */
    ret = snew(NetSocket);
    ret->sock.vt = &NetSocket_sockvt;
    ret->error = NULL;
    ret->plug = plug;
    bufchain_init(&ret->output_data);
    ret->writable = false;             /* to start with */
    ret->sending_oob = 0;
    ret->frozen = false;
    ret->localhost_only = local_host_only;
    ret->pending_error = 0;
    ret->parent = ret->child = NULL;
    ret->oobpending = false;
    ret->outgoingeof = EOF_NO;
    ret->incomingeof = false;
    ret->listener = true;
    ret->addr = NULL;
    ret->s = -1;

    /*
     * Translate address_family from platform-independent constants
     * into local reality.
     */
    address_family = (orig_address_family == ADDRTYPE_IPV4 ? AF_INET :
#ifndef NO_IPV6
                      orig_address_family == ADDRTYPE_IPV6 ? AF_INET6 :
#endif
                      AF_UNSPEC);

#ifndef NO_IPV6
    /* Let's default to IPv6.
     * If the stack doesn't support IPv6, we will fall back to IPv4. */
    if (address_family == AF_UNSPEC) address_family = AF_INET6;
#else
    /* No other choice, default to IPv4 */
    if (address_family == AF_UNSPEC)  address_family = AF_INET;
#endif

    /*
     * Open socket.
     */
    s = socket(address_family, SOCK_STREAM, 0);

#ifndef NO_IPV6
    /* If the host doesn't support IPv6 try fallback to IPv4. */
    if (s < 0 && address_family == AF_INET6) {
        address_family = AF_INET;
        s = socket(address_family, SOCK_STREAM, 0);
    }
#endif

    if (s < 0) {
        ret->error = strerror(errno);
        return &ret->sock;
    }

    cloexec(s);

    ret->oobinline = false;

    if (setsockopt(s, SOL_SOCKET, SO_REUSEADDR,
                   (const char *)&on, sizeof(on)) < 0) {
        ret->error = strerror(errno);
        close(s);
        return &ret->sock;
    }

    retcode = -1;
    addr = NULL; addrlen = -1;         /* placate optimiser */

    if (srcaddr != NULL) {
#ifndef NO_IPV6
        hints.ai_flags = AI_NUMERICHOST;
        hints.ai_family = address_family;
        hints.ai_socktype = SOCK_STREAM;
        hints.ai_protocol = 0;
        hints.ai_addrlen = 0;
        hints.ai_addr = NULL;
        hints.ai_canonname = NULL;
        hints.ai_next = NULL;
        assert(port >= 0 && port <= 99999);
        sprintf(portstr, "%d", port);
        {
            char *trimmed_addr = host_strduptrim(srcaddr);
            retcode = getaddrinfo(trimmed_addr, portstr, &hints, &ai);
            sfree(trimmed_addr);
        }
        if (retcode == 0) {
            addr = (union sockaddr_union *)ai->ai_addr;
            addrlen = ai->ai_addrlen;
        }
#else
        memset(&u,'\0',sizeof u);
        u.sin.sin_family = AF_INET;
        u.sin.sin_port = htons(port);
        u.sin.sin_addr.s_addr = inet_addr(srcaddr);
        if (u.sin.sin_addr.s_addr != (in_addr_t)(-1)) {
            /* Override localhost_only with specified listen addr. */
            ret->localhost_only = ipv4_is_loopback(u.sin.sin_addr);
        }
        addr = &u;
        addrlen = sizeof(u.sin);
        retcode = 0;
#endif
    }

    if (retcode != 0) {
        memset(&u,'\0',sizeof u);
#ifndef NO_IPV6
        if (address_family == AF_INET6) {
            u.sin6.sin6_family = AF_INET6;
            u.sin6.sin6_port = htons(port);
            if (local_host_only)
                u.sin6.sin6_addr = in6addr_loopback;
            else
                u.sin6.sin6_addr = in6addr_any;
            addr = &u;
            addrlen = sizeof(u.sin6);
        } else
#endif
        {
            u.sin.sin_family = AF_INET;
            u.sin.sin_port = htons(port);
            if (local_host_only)
                u.sin.sin_addr.s_addr = htonl(INADDR_LOOPBACK);
            else
                u.sin.sin_addr.s_addr = htonl(INADDR_ANY);
            addr = &u;
            addrlen = sizeof(u.sin);
        }
    }

    retcode = bind(s, &addr->sa, addrlen);

#ifndef NO_IPV6
    if (ai)
        freeaddrinfo(ai);
#endif

    if (retcode < 0) {
        close(s);
        ret->error = strerror(errno);
        return &ret->sock;
    }

    if (listen(s, SOMAXCONN) < 0) {
        close(s);
        ret->error = strerror(errno);
        return &ret->sock;
    }

#ifndef NO_IPV6
    /*
     * If we were given ADDRTYPE_UNSPEC, we must also create an
     * IPv4 listening socket and link it to this one.
     */
    if (address_family == AF_INET6 && orig_address_family == ADDRTYPE_UNSPEC) {
        NetSocket *other;

        other = container_of(
            sk_newlistener(srcaddr, port, plug,
                           local_host_only, ADDRTYPE_IPV4),
            NetSocket, sock);

        if (other) {
            if (!other->error) {
                other->parent = ret;
                ret->child = other;
            } else {
                /* If we couldn't create a listening socket on IPv4 as well
                 * as IPv6, we must return an error overall. */
                close(s);
                sfree(ret);
                return &other->sock;
            }
        }
    }
#endif

    ret->s = s;

    uxsel_tell(ret);
    add234(sktree, ret);

    return &ret->sock;
}